

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_4::ConvertFromFloat(void *dst,float *src,DataType dt,int numChannels)

{
  int in_ECX;
  float in_EDX;
  PtexHalf *in_RSI;
  void *in_RDI;
  float in_stack_ffffffffffffffdc;
  
  switch(in_EDX) {
  case 0.0:
    (anonymous_namespace)::ConvertArrayClamped<unsigned_char,float_const>
              ((uchar *)in_RSI,(float *)CONCAT44(in_EDX,in_ECX),0,in_EDX,in_stack_ffffffffffffffdc);
    break;
  case 1.4013e-45:
    (anonymous_namespace)::ConvertArrayClamped<unsigned_short,float_const>
              (&in_RSI->bits,(float *)CONCAT44(in_EDX,in_ECX),0,in_EDX,in_stack_ffffffffffffffdc);
    break;
  case 2.8026e-45:
    (anonymous_namespace)::ConvertArray<Ptex::v2_4::PtexHalf,float_const>
              (in_RSI,(float *)CONCAT44(in_EDX,in_ECX),0,in_EDX,in_stack_ffffffffffffffdc);
    break;
  case 4.2039e-45:
    memcpy(in_RDI,in_RSI,(long)in_ECX << 2);
  }
  return;
}

Assistant:

void ConvertFromFloat(void* dst, const float* src, DataType dt, int numChannels)
{
    switch (dt) {
    case dt_uint8:  ConvertArrayClamped(static_cast<uint8_t*>(dst),  src, numChannels, 255.0, 0.5); break;
    case dt_uint16: ConvertArrayClamped(static_cast<uint16_t*>(dst), src, numChannels, 65535.0, 0.5); break;
    case dt_half:   ConvertArray(static_cast<PtexHalf*>(dst), src, numChannels, 1.0); break;
    case dt_float:  memcpy(dst, src, sizeof(float)*numChannels); break;
    }
}